

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void djb::xyz_to_theta_phi(vec3 *wi,float_t *theta,float_t *phi)

{
  float_t fVar1;
  double dVar2;
  float_t *phi_local;
  float_t *theta_local;
  vec3 *wi_local;
  
  if (wi->z <= 0.99999) {
    if (-0.99999 < wi->z || wi->z == -0.99999) {
      dVar2 = std::acos((double)(ulong)(uint)wi->z);
      *theta = SUB84(dVar2,0);
      dVar2 = std::atan2((double)(ulong)(uint)wi->y,(double)(ulong)(uint)wi->x);
      *phi = SUB84(dVar2,0);
    }
    else {
      fVar1 = m_pi();
      *theta = fVar1;
      *phi = 0.0;
    }
  }
  else {
    *phi = 0.0;
    *theta = 0.0;
  }
  return;
}

Assistant:

static void xyz_to_theta_phi(const vec3 &wi, float_t *theta, float_t *phi)
{
	if (wi.z > (float_t)0.99999) {
		(*theta) = (*phi) = 0.0;
	} else if (wi.z < (float_t)-0.99999) {
		(*theta) = m_pi();
		(*phi) = 0.0;
	} else {
		(*theta) = acos(wi.z);
		(*phi) = atan2(wi.y, wi.x);
	}
}